

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

size_t __thiscall
kj::FdInputStream::tryRead(FdInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  int code;
  ssize_t sVar1;
  void *__buf;
  Fault f;
  Fault local_38;
  
  __buf = buffer;
  if (0 < (long)minBytes) {
    do {
      do {
        sVar1 = read(this->fd,__buf,(long)buffer + (maxBytes - (long)__buf));
        if (-1 < sVar1) {
          if (sVar1 != 0) goto LAB_001b4a7b;
          goto LAB_001b4a83;
        }
        code = _::Debug::getOsErrorNumber(false);
      } while (code == -1);
      if (code != 0) {
        _::Debug::Fault::Fault<int,int&>
                  (&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                   ,0x15d,code,"n = miniposix::read(fd, pos, max - pos)","fd",&this->fd);
        _::Debug::Fault::fatal(&local_38);
      }
LAB_001b4a7b:
      __buf = (void *)((long)__buf + sVar1);
    } while (__buf < (void *)(minBytes + (long)buffer));
  }
LAB_001b4a83:
  return (long)__buf - (long)buffer;
}

Assistant:

size_t FdInputStream::tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
  byte* pos = reinterpret_cast<byte*>(buffer);
  byte* min = pos + minBytes;
  byte* max = pos + maxBytes;

  while (pos < min) {
    miniposix::ssize_t n;
    KJ_SYSCALL(n = miniposix::read(fd, pos, max - pos), fd);
    if (n == 0) {
      break;
    }
    pos += n;
  }

  return pos - reinterpret_cast<byte*>(buffer);
}